

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

void __thiscall NetworkNS::dump::dump(dump *this,string *filename_to_open)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *this_00;
  string *filename_to_open_local;
  dump *this_local;
  
  this->_vptr_dump = (_func_int **)&PTR__dump_00125d90;
  std::ofstream::ofstream(&this->my_file);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&this->my_file,_Var2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Specified dump file does not exist!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

dump::dump(std::string filename_to_open) {
      
      my_file.open(filename_to_open.c_str(), ofstream::out);
      if (not my_file.good())
         cout << "Specified dump file does not exist!" << endl;

   }